

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_certificate.cc
# Opt level: O0

bool __thiscall bssl::anon_unknown_0::IsSequenceTLV(anon_unknown_0 *this,Input input)

{
  Input input_00;
  bool bVar1;
  undefined1 local_60 [8];
  Parser unused_sequence_parser;
  undefined1 local_38 [8];
  Parser parser;
  Input input_local;
  
  input_00.data_.size_ = (size_t)input.data_.data_;
  input_00.data_.data_ = (uchar *)this;
  unused_sequence_parser.advance_len_ = (size_t)this;
  parser.advance_len_ = (size_t)this;
  bssl::der::Parser::Parser((Parser *)local_38,input_00);
  bssl::der::Parser::Parser((Parser *)local_60);
  bVar1 = bssl::der::Parser::ReadSequence((Parser *)local_38,(Parser *)local_60);
  if (bVar1) {
    bVar1 = bssl::der::Parser::HasMore((Parser *)local_38);
    input_local.data_.size_._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
  }
  else {
    input_local.data_.size_._7_1_ = false;
  }
  return input_local.data_.size_._7_1_;
}

Assistant:

[[nodiscard]] bool IsSequenceTLV(der::Input input) {
  der::Parser parser(input);
  der::Parser unused_sequence_parser;
  if (!parser.ReadSequence(&unused_sequence_parser)) {
    return false;
  }
  // Should by a single SEQUENCE by definition of the function.
  return !parser.HasMore();
}